

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigSudokuVisualizer.cpp
# Opt level: O3

string * __thiscall
BigSudokuVisualizer::createCells_abi_cxx11_
          (string *__return_storage_ptr__,BigSudokuVisualizer *this,SudokuGitter *gitter1,
          SudokuGitter *gitter2)

{
  bool bVar1;
  int iVar2;
  char cVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  cell cVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  char *__end;
  uint col;
  string __str;
  string colspan;
  char *local_a0;
  uint local_98;
  char local_90 [20];
  uint local_7c;
  ulong local_78;
  SudokuGitter *local_70;
  SudokuGitter *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  ulong local_38;
  
  local_7c = gitter1->elements;
  uVar5 = gitter1->quadHeight;
  uVar11 = local_7c - gitter1->quadWidth;
  local_60 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
  local_70 = gitter1;
  local_68 = gitter2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"","");
  std::__cxx11::string::append((char *)local_58);
  cVar4 = '\x01';
  if (9 < uVar11) {
    uVar12 = uVar11;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar12 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00113bf5;
      }
      if (uVar12 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00113bf5;
      }
      if (uVar12 < 10000) goto LAB_00113bf5;
      bVar1 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_00113bf5:
  local_a0 = local_90;
  std::__cxx11::string::_M_construct((ulong)&local_a0,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_a0,local_98,uVar11);
  std::__cxx11::string::_M_append((char *)local_58,(ulong)local_a0);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  std::__cxx11::string::append((char *)local_58);
  uVar11 = 0;
  uVar12 = 0;
  uVar5 = local_7c - uVar5;
  local_38 = (ulong)uVar5;
  if (uVar5 != 0) {
    uVar12 = 0;
    local_78 = local_78 & 0xffffffff00000000;
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (local_7c != 0) {
        uVar5 = 0;
        do {
          cVar7 = SudokuGitter::getCell(local_70,(uint)local_78,uVar5);
          uVar9 = cVar7.value;
          if (uVar9 == 0) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            cVar4 = '\x01';
            if (9 < uVar12) {
              uVar10 = (ulong)uVar12;
              cVar3 = '\x04';
              do {
                cVar4 = cVar3;
                uVar9 = (uint)uVar10;
                if (uVar9 < 100) {
                  cVar4 = cVar4 + -2;
                  goto LAB_00113e8e;
                }
                if (uVar9 < 1000) {
                  cVar4 = cVar4 + -1;
                  goto LAB_00113e8e;
                }
                if (uVar9 < 10000) goto LAB_00113e8e;
                uVar10 = uVar10 / 10000;
                cVar3 = cVar4 + '\x04';
              } while (99999 < uVar9);
              cVar4 = cVar4 + '\x01';
            }
LAB_00113e8e:
            local_a0 = local_90;
            std::__cxx11::string::_M_construct((ulong)&local_a0,cVar4);
            std::__detail::__to_chars_10_impl<unsigned_int>(local_a0,local_98,uVar12);
            std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0);
            if (local_a0 != local_90) {
              operator_delete(local_a0);
            }
          }
          else {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            cVar4 = '\x01';
            if (9 < uVar12) {
              uVar8 = uVar12;
              cVar3 = '\x04';
              do {
                cVar4 = cVar3;
                if (uVar8 < 100) {
                  cVar4 = cVar4 + -2;
                  goto LAB_00113d86;
                }
                if (uVar8 < 1000) {
                  cVar4 = cVar4 + -1;
                  goto LAB_00113d86;
                }
                if (uVar8 < 10000) goto LAB_00113d86;
                bVar1 = 99999 < uVar8;
                uVar8 = uVar8 / 10000;
                cVar3 = cVar4 + '\x04';
              } while (bVar1);
              cVar4 = cVar4 + '\x01';
            }
LAB_00113d86:
            local_a0 = local_90;
            std::__cxx11::string::_M_construct((ulong)&local_a0,cVar4);
            std::__detail::__to_chars_10_impl<unsigned_int>(local_a0,local_98,uVar12);
            std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0);
            if (local_a0 != local_90) {
              operator_delete(local_a0);
            }
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            cVar4 = '\x01';
            if (9 < uVar9) {
              cVar3 = '\x04';
              do {
                cVar4 = cVar3;
                uVar8 = cVar7.value;
                if (uVar8 < 100) {
                  cVar4 = cVar4 + -2;
                  goto LAB_00113e2f;
                }
                if (uVar8 < 1000) {
                  cVar4 = cVar4 + -1;
                  goto LAB_00113e2f;
                }
                if (uVar8 < 10000) goto LAB_00113e2f;
                cVar7 = (cell)(((ulong)cVar7 & 0xffffffff) / 10000);
                cVar3 = cVar4 + '\x04';
              } while (99999 < uVar8);
              cVar4 = cVar4 + '\x01';
            }
LAB_00113e2f:
            local_a0 = local_90;
            std::__cxx11::string::_M_construct((ulong)&local_a0,cVar4);
            std::__detail::__to_chars_10_impl<unsigned_int>(local_a0,local_98,uVar9);
            std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0);
            if (local_a0 != local_90) {
              operator_delete(local_a0);
            }
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          uVar12 = uVar12 + 1;
          uVar5 = uVar5 + 1;
        } while (uVar5 != local_7c);
      }
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58[0]);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      iVar6 = (uint)local_78 + 1;
      local_78 = CONCAT44(local_78._4_4_,iVar6);
    } while (iVar6 != (int)local_38);
  }
  if (local_70->quadHeight != 0) {
    uVar11 = 0;
    local_78 = 0;
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (local_7c != 0) {
        iVar6 = (int)local_78;
        iVar2 = (int)local_38;
        uVar5 = 0;
        do {
          cVar7 = SudokuGitter::getCell(local_70,iVar6 + iVar2,uVar5);
          uVar9 = cVar7.value;
          if (uVar9 == 0) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            cVar4 = '\x01';
            if (9 < uVar12) {
              uVar10 = (ulong)uVar12;
              cVar3 = '\x04';
              do {
                cVar4 = cVar3;
                uVar9 = (uint)uVar10;
                if (uVar9 < 100) {
                  cVar4 = cVar4 + -2;
                  goto LAB_00114176;
                }
                if (uVar9 < 1000) {
                  cVar4 = cVar4 + -1;
                  goto LAB_00114176;
                }
                if (uVar9 < 10000) goto LAB_00114176;
                uVar10 = uVar10 / 10000;
                cVar3 = cVar4 + '\x04';
              } while (99999 < uVar9);
              cVar4 = cVar4 + '\x01';
            }
LAB_00114176:
            local_a0 = local_90;
            std::__cxx11::string::_M_construct((ulong)&local_a0,cVar4);
            std::__detail::__to_chars_10_impl<unsigned_int>(local_a0,local_98,uVar12);
            std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0);
            if (local_a0 != local_90) {
              operator_delete(local_a0);
            }
          }
          else {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            cVar4 = '\x01';
            if (9 < uVar12) {
              uVar10 = (ulong)uVar12;
              cVar3 = '\x04';
              do {
                cVar4 = cVar3;
                uVar8 = (uint)uVar10;
                if (uVar8 < 100) {
                  cVar4 = cVar4 + -2;
                  goto LAB_00114069;
                }
                if (uVar8 < 1000) {
                  cVar4 = cVar4 + -1;
                  goto LAB_00114069;
                }
                if (uVar8 < 10000) goto LAB_00114069;
                uVar10 = uVar10 / 10000;
                cVar3 = cVar4 + '\x04';
              } while (99999 < uVar8);
              cVar4 = cVar4 + '\x01';
            }
LAB_00114069:
            local_a0 = local_90;
            std::__cxx11::string::_M_construct((ulong)&local_a0,cVar4);
            std::__detail::__to_chars_10_impl<unsigned_int>(local_a0,local_98,uVar12);
            std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0);
            if (local_a0 != local_90) {
              operator_delete(local_a0);
            }
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            cVar4 = '\x01';
            if (9 < uVar9) {
              cVar3 = '\x04';
              do {
                cVar4 = cVar3;
                uVar8 = cVar7.value;
                if (uVar8 < 100) {
                  cVar4 = cVar4 + -2;
                  goto LAB_00114117;
                }
                if (uVar8 < 1000) {
                  cVar4 = cVar4 + -1;
                  goto LAB_00114117;
                }
                if (uVar8 < 10000) goto LAB_00114117;
                cVar7 = (cell)(((ulong)cVar7 & 0xffffffff) / 10000);
                cVar3 = cVar4 + '\x04';
              } while (99999 < uVar8);
              cVar4 = cVar4 + '\x01';
            }
LAB_00114117:
            local_a0 = local_90;
            std::__cxx11::string::_M_construct((ulong)&local_a0,cVar4);
            std::__detail::__to_chars_10_impl<unsigned_int>(local_a0,local_98,uVar9);
            std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0);
            if (local_a0 != local_90) {
              operator_delete(local_a0);
            }
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          uVar12 = uVar12 + 1;
          uVar5 = uVar5 + 1;
        } while (uVar5 != local_7c);
      }
      uVar5 = local_68->quadWidth;
      uVar11 = uVar11 + uVar5;
      uVar5 = uVar5 - (uVar5 == local_7c);
      if (uVar5 < local_7c) {
        do {
          cVar7 = SudokuGitter::getCell(local_68,(uint)local_78,uVar5);
          uVar9 = cVar7.value;
          if (uVar9 == 0) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            cVar4 = '\x01';
            if (9 < uVar11) {
              uVar10 = (ulong)uVar11;
              cVar3 = '\x04';
              do {
                cVar4 = cVar3;
                uVar9 = (uint)uVar10;
                if (uVar9 < 100) {
                  cVar4 = cVar4 + -2;
                  goto LAB_00114405;
                }
                if (uVar9 < 1000) {
                  cVar4 = cVar4 + -1;
                  goto LAB_00114405;
                }
                if (uVar9 < 10000) goto LAB_00114405;
                uVar10 = uVar10 / 10000;
                cVar3 = cVar4 + '\x04';
              } while (99999 < uVar9);
              cVar4 = cVar4 + '\x01';
            }
LAB_00114405:
            local_a0 = local_90;
            std::__cxx11::string::_M_construct((ulong)&local_a0,cVar4);
            std::__detail::__to_chars_10_impl<unsigned_int>(local_a0,local_98,uVar11);
            std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0);
            if (local_a0 != local_90) {
              operator_delete(local_a0);
            }
          }
          else {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            cVar4 = '\x01';
            if (9 < uVar11) {
              uVar10 = (ulong)uVar11;
              cVar3 = '\x04';
              do {
                cVar4 = cVar3;
                uVar8 = (uint)uVar10;
                if (uVar8 < 100) {
                  cVar4 = cVar4 + -2;
                  goto LAB_001142f9;
                }
                if (uVar8 < 1000) {
                  cVar4 = cVar4 + -1;
                  goto LAB_001142f9;
                }
                if (uVar8 < 10000) goto LAB_001142f9;
                uVar10 = uVar10 / 10000;
                cVar3 = cVar4 + '\x04';
              } while (99999 < uVar8);
              cVar4 = cVar4 + '\x01';
            }
LAB_001142f9:
            local_a0 = local_90;
            std::__cxx11::string::_M_construct((ulong)&local_a0,cVar4);
            std::__detail::__to_chars_10_impl<unsigned_int>(local_a0,local_98,uVar11);
            std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0);
            if (local_a0 != local_90) {
              operator_delete(local_a0);
            }
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            cVar4 = '\x01';
            if (9 < uVar9) {
              cVar3 = '\x04';
              do {
                cVar4 = cVar3;
                uVar8 = cVar7.value;
                if (uVar8 < 100) {
                  cVar4 = cVar4 + -2;
                  goto LAB_001143a6;
                }
                if (uVar8 < 1000) {
                  cVar4 = cVar4 + -1;
                  goto LAB_001143a6;
                }
                if (uVar8 < 10000) goto LAB_001143a6;
                cVar7 = (cell)(((ulong)cVar7 & 0xffffffff) / 10000);
                cVar3 = cVar4 + '\x04';
              } while (99999 < uVar8);
              cVar4 = cVar4 + '\x01';
            }
LAB_001143a6:
            local_a0 = local_90;
            std::__cxx11::string::_M_construct((ulong)&local_a0,cVar4);
            std::__detail::__to_chars_10_impl<unsigned_int>(local_a0,local_98,uVar9);
            std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0);
            if (local_a0 != local_90) {
              operator_delete(local_a0);
            }
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          uVar11 = uVar11 + 1;
          uVar5 = uVar5 + 1;
        } while (uVar5 < local_7c);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar5 = (int)local_78 + 1;
      local_78 = (ulong)uVar5;
    } while (uVar5 < local_70->quadHeight);
  }
  uVar5 = local_68->quadHeight;
  if (uVar5 < local_7c) {
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58[0]);
      uVar12 = 0;
      do {
        cVar7 = SudokuGitter::getCell(local_68,uVar5,uVar12);
        uVar9 = cVar7.value;
        if (uVar9 == 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          cVar4 = '\x01';
          if (9 < uVar11) {
            uVar10 = (ulong)uVar11;
            cVar3 = '\x04';
            do {
              cVar4 = cVar3;
              uVar9 = (uint)uVar10;
              if (uVar9 < 100) {
                cVar4 = cVar4 + -2;
                goto LAB_001146c4;
              }
              if (uVar9 < 1000) {
                cVar4 = cVar4 + -1;
                goto LAB_001146c4;
              }
              if (uVar9 < 10000) goto LAB_001146c4;
              uVar10 = uVar10 / 10000;
              cVar3 = cVar4 + '\x04';
            } while (99999 < uVar9);
            cVar4 = cVar4 + '\x01';
          }
LAB_001146c4:
          local_a0 = local_90;
          std::__cxx11::string::_M_construct((ulong)&local_a0,cVar4);
          std::__detail::__to_chars_10_impl<unsigned_int>(local_a0,local_98,uVar11);
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0);
          if (local_a0 != local_90) {
            operator_delete(local_a0);
          }
        }
        else {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          cVar4 = '\x01';
          if (9 < uVar11) {
            uVar10 = (ulong)uVar11;
            cVar3 = '\x04';
            do {
              cVar4 = cVar3;
              uVar8 = (uint)uVar10;
              if (uVar8 < 100) {
                cVar4 = cVar4 + -2;
                goto LAB_001145bd;
              }
              if (uVar8 < 1000) {
                cVar4 = cVar4 + -1;
                goto LAB_001145bd;
              }
              if (uVar8 < 10000) goto LAB_001145bd;
              uVar10 = uVar10 / 10000;
              cVar3 = cVar4 + '\x04';
            } while (99999 < uVar8);
            cVar4 = cVar4 + '\x01';
          }
LAB_001145bd:
          local_a0 = local_90;
          std::__cxx11::string::_M_construct((ulong)&local_a0,cVar4);
          std::__detail::__to_chars_10_impl<unsigned_int>(local_a0,local_98,uVar11);
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0);
          if (local_a0 != local_90) {
            operator_delete(local_a0);
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          cVar4 = '\x01';
          if (9 < uVar9) {
            cVar3 = '\x04';
            do {
              cVar4 = cVar3;
              uVar8 = cVar7.value;
              if (uVar8 < 100) {
                cVar4 = cVar4 + -2;
                goto LAB_00114665;
              }
              if (uVar8 < 1000) {
                cVar4 = cVar4 + -1;
                goto LAB_00114665;
              }
              if (uVar8 < 10000) goto LAB_00114665;
              cVar7 = (cell)(((ulong)cVar7 & 0xffffffff) / 10000);
              cVar3 = cVar4 + '\x04';
            } while (99999 < uVar8);
            cVar4 = cVar4 + '\x01';
          }
LAB_00114665:
          local_a0 = local_90;
          std::__cxx11::string::_M_construct((ulong)&local_a0,cVar4);
          std::__detail::__to_chars_10_impl<unsigned_int>(local_a0,local_98,uVar9);
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0);
          if (local_a0 != local_90) {
            operator_delete(local_a0);
          }
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar11 = uVar11 + 1;
        uVar12 = uVar12 + 1;
      } while (uVar12 != local_7c);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar5 = uVar5 + 1;
    } while (uVar5 != local_7c);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string BigSudokuVisualizer::createCells(SudokuGitter gitter1, SudokuGitter gitter2) {
    unsigned int size = gitter1.getElements();
    unsigned int colspan_size = size - gitter1.getQuadWidth();
    unsigned int rowspan_size = size - gitter1.getQuadHeight();

    std::string cells = "";
    std::string colspan = "";
    colspan.append("<td style='border: none' colspan='");
    colspan.append(std::to_string(colspan_size));
    colspan.append("'></td>");

    unsigned int counter = 0;
    unsigned int counter2 = 0;
    for (unsigned int row = 0; row < rowspan_size; row++) {
        cells.append("<tr>");
        for (unsigned int col = 0; col < size; col++) {
            unsigned int num = gitter1.getCell(row, col).value;
            if (num > 0) {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter));
                cells.append("' type='text' value='");
                cells.append(std::to_string(num));
                cells.append("' disabled></td>");
            } else {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter));
                cells.append("' type='text'></td>");
            }
            counter++;
        }
        cells.append(colspan);
        cells.append("</tr>");
    }

    for(unsigned int times = 0; times < gitter1.getQuadHeight(); times++){
        cells.append("<tr>");
        for (unsigned int col = 0; col < size; col++) {
            unsigned int num = gitter1.getCell(times + rowspan_size, col).value;
            if (num > 0) {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter));
                cells.append("' type='text' value='");
                cells.append(std::to_string(num));
                cells.append("' disabled></td>");
            } else {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter));
                cells.append("' type='text'></td>");
            }
            counter++;
        }
        counter2 += gitter2.getQuadWidth();
        unsigned int col = gitter2.getQuadWidth();
        if(col == size){
            col--;
        }
        for (col; col < size; col++) {
            unsigned int num = gitter2.getCell(times, col).value;
            if (num > 0) {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter2));
                cells.append("' type='text' value='");
                cells.append(std::to_string(num));
                cells.append("' disabled></td>");
            } else {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter2));
                cells.append("' type='text'></td>");
            }
            counter2++;
        }
        cells.append("</tr>");
    }
    for (unsigned int row = gitter2.getQuadHeight(); row < size; row++) {
        cells.append("<tr>");
        cells.append(colspan);
        for (unsigned int col = 0; col < size; col++) {
            unsigned int num = gitter2.getCell(row, col).value;
            if (num > 0) {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter2));
                cells.append("' type='text' value='");
                cells.append(std::to_string(num));
                cells.append("' disabled></td>");
            } else {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter2));
                cells.append("' type='text'></td>");
            }
            counter2++;
        }
        cells.append("</tr>");
    }
    return cells;
}